

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

FOptionMenuItem * __thiscall DOptionMenu::GetItem(DOptionMenu *this,FName *name)

{
  FOptionMenuItem *pFVar1;
  FOptionMenuDescriptor *pFVar2;
  ulong uVar3;
  FName nm;
  int local_2c;
  
  pFVar2 = this->mDesc;
  if ((pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar3];
      (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[7])(&local_2c,pFVar1,0);
      if (local_2c == name->Index) {
        return (this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar3]
        ;
      }
      uVar3 = uVar3 + 1;
      pFVar2 = this->mDesc;
    } while (uVar3 < (pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count);
  }
  return (FOptionMenuItem *)0x0;
}

Assistant:

FOptionMenuItem *DOptionMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}